

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1195::run(TestCase1195 *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint i;
  Orphanage OVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  MallocMessageBuilder message;
  uint local_1a0;
  ListElementCount local_19c;
  OrphanBuilder local_198;
  ListReader local_178;
  ListBuilder local_148;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  OVar4 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_178,OVar4.arena,OVar4.capTable,7,FOUR_BYTES);
  local_198.capTable = (CapTableBuilder *)local_178.ptr;
  local_198.tag.content = (uint64_t)local_178.segment;
  local_198.segment = (SegmentBuilder *)local_178.capTable;
  OrphanBuilder::asList(&local_148,&local_198,FOUR_BYTES);
  lVar2 = -7;
  uVar3 = 0;
  do {
    *(int *)(local_148.ptr + (uVar3 >> 3)) = (int)lVar2 + 0x75bcd1c;
    uVar3 = uVar3 + local_148.step;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  AVar5 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
  if (((AVar5.ptr)->size_ != 5) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 5;
    AVar5 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
    local_178.segment = (SegmentReader *)(AVar5.ptr)->size_;
    kj::_::Debug::log<char_const(&)[67],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b3,ERROR,
               "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", 5, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
               (int *)&local_1a0,(unsigned_long *)&local_178);
  }
  OrphanBuilder::truncate(&local_198,(char *)0x3,4);
  AVar5 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
  if (((AVar5.ptr)->size_ != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 3;
    AVar5 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
    local_178.segment = (SegmentReader *)(AVar5.ptr)->size_;
    kj::_::Debug::log<char_const(&)[67],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b5,ERROR,
               "\"failed: expected \" \"(3) == (message.getSegmentsForOutput()[0].size())\", 3, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (3) == (message.getSegmentsForOutput()[0].size())",
               (int *)&local_1a0,(unsigned_long *)&local_178);
  }
  OrphanBuilder::asListReader(&local_178,&local_198,FOUR_BYTES);
  if ((local_178.elementCount != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 3;
    local_19c = local_178.elementCount;
    kj::_::Debug::log<char_const(&)[40],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b8,ERROR,"\"failed: expected \" \"(3) == (reader.size())\", 3, reader.size()",
               (char (*) [40])"failed: expected (3) == (reader.size())",(int *)&local_1a0,&local_19c
              );
  }
  uVar3 = 0x75bcd15;
  do {
    uVar1 = (ulong)local_148.step * (uVar3 - 0x75bcd15) >> 3;
    if ((uVar3 != *(uint *)(local_148.ptr + uVar1)) && (kj::_::Debug::minSeverity < 3)) {
      local_19c = *(ListElementCount *)(local_148.ptr + uVar1);
      local_1a0 = (uint)uVar3;
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bb,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (builder[i])\", 123456789 + i, builder[i]"
                 ,(char (*) [49])"failed: expected (123456789 + i) == (builder[i])",&local_1a0,
                 &local_19c);
    }
    uVar1 = (uVar3 - 0x75bcd15) * (ulong)local_178.step >> 3;
    if ((uVar3 != *(uint *)((long)&((CapTableReader *)local_178.ptr)->_vptr_CapTableReader + uVar1))
       && (kj::_::Debug::minSeverity < 3)) {
      local_19c = *(ListElementCount *)
                   ((long)&((CapTableReader *)local_178.ptr)->_vptr_CapTableReader + uVar1);
      local_1a0 = (uint)uVar3;
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bc,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (reader[i])\", 123456789 + i, reader[i]"
                 ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",&local_1a0,
                 &local_19c);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x75bcd18);
  lVar2 = 3;
  do {
    uVar3 = (ulong)local_148.step * lVar2 >> 3;
    if ((*(int *)(local_148.ptr + uVar3) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_1a0 = 0;
      local_19c = *(ListElementCount *)(local_148.ptr + uVar3);
      kj::_::Debug::log<char_const(&)[37],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bf,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                 (char (*) [37])"failed: expected (0) == (builder[i])",(int *)&local_1a0,&local_19c)
      ;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  local_148.ptr[0] = 'A';
  local_148.ptr[1] = '\x01';
  local_148.ptr[2] = '\0';
  local_148.ptr[3] = '\0';
  if ((*(int *)&((CapTableReader *)local_178.ptr)->_vptr_CapTableReader != 0x141) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 0x141;
    local_19c = *(ListElementCount *)&((CapTableReader *)local_178.ptr)->_vptr_CapTableReader;
    kj::_::Debug::log<char_const(&)[38],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4c5,ERROR,"\"failed: expected \" \"(321) == (reader[0])\", 321, reader[0]",
               (char (*) [38])"failed: expected (321) == (reader[0])",(int *)&local_1a0,&local_19c);
  }
  if (local_198.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_198);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Orphans, TruncatePrimitiveList) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());
  orphan.truncate(3);
  EXPECT_EQ(3, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(123456789 + i, builder[i]);
    EXPECT_EQ(123456789 + i, reader[i]);
  }
  for (uint i = 3; i < 7; i++) {
    EXPECT_EQ(0, builder[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(321, reader[0]);
}